

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddNeg.c
# Opt level: O0

DdNode * Cudd_addRoundOff(DdManager *dd,DdNode *f,int N)

{
  DdNode *pDVar1;
  double trunc_00;
  double trunc;
  DdNode *res;
  int N_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  trunc_00 = pow(10.0,(double)N);
  do {
    pDVar1 = cuddAddRoundOffRecur(dd,f,trunc_00);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addRoundOff(
  DdManager * dd,
  DdNode * f,
  int  N)
{
    DdNode *res;
    double trunc = pow(10.0,(double)N);

    do {
        res = cuddAddRoundOffRecur(dd,f,trunc);
    } while (dd->reordered == 1);
    return(res);

}